

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O0

int duckdb::DecimalToString::DecimalLength<long>(long value,uint8_t width,uint8_t scale)

{
  int iVar1;
  int iVar2;
  byte in_DL;
  byte in_SIL;
  long in_RDI;
  int extra_characters;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_4;
  
  if (in_DL == 0) {
    local_4 = NumericHelper::SignedLength<long,_unsigned_long>
                        (CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  else {
    iVar1 = 1;
    if (in_DL < in_SIL) {
      iVar1 = 2;
    }
    iVar1 = (uint)in_DL + iVar1 + (uint)(in_RDI < 0);
    iVar2 = NumericHelper::SignedLength<long,_unsigned_long>
                      (CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    local_4 = MaxValue<int>(iVar1,iVar2 + 1);
  }
  return local_4;
}

Assistant:

static int DecimalLength(SIGNED value, uint8_t width, uint8_t scale) {
		using UNSIGNED = typename MakeUnsigned<SIGNED>::type;
		if (scale == 0) {
			// scale is 0: regular number
			return NumericHelper::SignedLength<SIGNED, UNSIGNED>(value);
		}
		// length is max of either:
		// scale + 2 OR
		// integer length + 1
		// scale + 2 happens when the number is in the range of (-1, 1)
		// in that case we print "0.XXX", which is the scale, plus "0." (2 chars)
		// integer length + 1 happens when the number is outside of that range
		// in that case we print the integer number, but with one extra character ('.')
		auto extra_characters = width > scale ? 2 : 1;
		return MaxValue(scale + extra_characters + (value < 0 ? 1 : 0),
		                NumericHelper::SignedLength<SIGNED, UNSIGNED>(value) + 1);
	}